

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

void __thiscall
duckdb::IEJoinLocalSourceState::IEJoinLocalSourceState
          (IEJoinLocalSourceState *this,ClientContext *context,PhysicalIEJoin *op)

{
  Allocator *allocator;
  const_reference this_00;
  pointer pEVar1;
  type pEVar2;
  pointer pJVar3;
  pointer pJVar4;
  idx_t i;
  ulong __n;
  vector<duckdb::LogicalType,_true> right_types;
  vector<duckdb::LogicalType,_true> left_types;
  
  (this->super_LocalSourceState)._vptr_LocalSourceState =
       (_func_int **)&PTR__IEJoinLocalSourceState_017a2c30;
  this->op = op;
  (this->joiner).super_unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>.
  _M_t.super___uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>.
  super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl = (IEJoinUnion *)0x0;
  SelectionVector::SelectionVector(&this->true_sel,0x800);
  ExpressionExecutor::ExpressionExecutor(&this->left_executor,context);
  DataChunk::DataChunk(&this->left_keys);
  ExpressionExecutor::ExpressionExecutor(&this->right_executor,context);
  DataChunk::DataChunk(&this->right_keys);
  DataChunk::DataChunk(&this->unprojected);
  this->left_matches = (bool *)0x0;
  this->right_matches = (bool *)0x0;
  allocator = Allocator::Get(context);
  DataChunk::Initialize
            (&this->unprojected,allocator,&(op->super_PhysicalRangeJoin).unprojected_types,0x800);
  pJVar4 = (op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_start;
  pJVar3 = *(pointer *)
            ((long)&(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (2 < (ulong)(((long)pJVar3 - (long)pJVar4) / 0x18)) {
    left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (__n = 2; __n < (ulong)(((long)pJVar3 - (long)pJVar4) / 0x18); __n = __n + 1) {
      this_00 = vector<duckdb::JoinCondition,_true>::get<true>
                          (&(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions,
                           __n);
      pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&this_00->left);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                 ,&pEVar1->return_type);
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&this_00->left);
      ExpressionExecutor::AddExpression(&this->left_executor,pEVar2);
      pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&this_00->left);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&right_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &pEVar1->return_type);
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&this_00->right);
      ExpressionExecutor::AddExpression(&this->right_executor,pEVar2);
      pJVar4 = (op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pJVar3 = *(pointer *)
                ((long)&(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
                        super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                        super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                        ._M_impl.super__Vector_impl_data + 8);
    }
    DataChunk::Initialize(&this->left_keys,allocator,&left_types,0x800);
    DataChunk::Initialize(&this->right_keys,allocator,&right_types,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
    ;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  }
  return;
}

Assistant:

explicit IEJoinLocalSourceState(ClientContext &context, const PhysicalIEJoin &op)
	    : op(op), true_sel(STANDARD_VECTOR_SIZE), left_executor(context), right_executor(context),
	      left_matches(nullptr), right_matches(nullptr) {
		auto &allocator = Allocator::Get(context);
		unprojected.Initialize(allocator, op.unprojected_types);

		if (op.conditions.size() < 3) {
			return;
		}

		vector<LogicalType> left_types;
		vector<LogicalType> right_types;
		for (idx_t i = 2; i < op.conditions.size(); ++i) {
			const auto &cond = op.conditions[i];

			left_types.push_back(cond.left->return_type);
			left_executor.AddExpression(*cond.left);

			right_types.push_back(cond.left->return_type);
			right_executor.AddExpression(*cond.right);
		}

		left_keys.Initialize(allocator, left_types);
		right_keys.Initialize(allocator, right_types);
	}